

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrLDY0xac(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = absolute_addr(in_RDI);
  LDY(in_RDI,argument);
  return 4;
}

Assistant:

int CPU::instrLDY0xac() {
	LDY(absolute_addr());
	return 4;
}